

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_constant_expression.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::ExpressionBinder::BindExpression
          (BindResult *__return_storage_ptr__,ExpressionBinder *this,ConstantExpression *expr,
          idx_t depth)

{
  _Head_base<0UL,_duckdb::Expression_*,_false> local_20;
  Expression *local_18;
  
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_18,&expr->value);
  local_20._M_head_impl = local_18;
  local_18 = (Expression *)0x0;
  BindResult::BindResult
            (__return_storage_ptr__,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_20);
  if (local_20._M_head_impl != (Expression *)0x0) {
    (*((local_20._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_20._M_head_impl = (Expression *)0x0;
  if (local_18 != (Expression *)0x0) {
    (**(code **)(*(long *)local_18 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult ExpressionBinder::BindExpression(ConstantExpression &expr, idx_t depth) {
	return BindResult(make_uniq<BoundConstantExpression>(expr.value));
}